

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

string * soul::TokenisedPathString::removeTopLevelNameIfPresent
                   (string *__return_storage_ptr__,string *path,string *nameToRemove)

{
  string_view s;
  string_view t;
  bool bVar1;
  string *nameToRemove_local;
  string *path_local;
  
  std::__cxx11::string::operator+=((string *)nameToRemove,"::");
  t = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)path);
  s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)nameToRemove);
  bVar1 = choc::text::startsWith(t,s);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string removeTopLevelNameIfPresent (const std::string& path, std::string nameToRemove)
    {
        nameToRemove += "::";

        if (choc::text::startsWith (path, nameToRemove))
            return path.substr (nameToRemove.length());

        return path;
    }